

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::BindDecimalArgMinMax<duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>>
          (duckdb *this,ClientContext *context,AggregateFunction *function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  reference pvVar1;
  pointer pEVar2;
  reference pvVar3;
  LogicalType *pLVar4;
  ulong uVar5;
  LogicalType *__n;
  idx_t i;
  LogicalType *__n_00;
  LogicalType by_type;
  value_type local_1d7;
  LogicalType decimal_type;
  char local_1b7;
  vector<duckdb::LogicalType,_true> by_types;
  type name;
  AggregateFunction local_160;
  
  pLVar4 = (LogicalType *)arguments;
  pvVar1 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,0);
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar1);
  duckdb::LogicalType::LogicalType(&decimal_type,(LogicalType *)(pEVar2 + 0x38));
  pvVar1 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,1);
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar1);
  duckdb::LogicalType::LogicalType(&by_type,(LogicalType *)(pEVar2 + 0x38));
  ArgMaxByTypes();
  __n = (LogicalType *)0xffffffffffffffff;
  for (__n_00 = (LogicalType *)0x0;
      __n_00 < (LogicalType *)
               (((long)by_types.
                       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)by_types.
                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      _M_impl.super__Vector_impl_data._M_start) / 0x18); __n_00 = __n_00 + 1) {
    pvVar3 = vector<duckdb::LogicalType,_true>::get<true>(&by_types,(size_type)__n_00);
    if (pvVar3[1] == local_1d7) goto LAB_00520bb2;
    pLVar4 = (LogicalType *)duckdb::CastFunctionSet::Get(context);
    vector<duckdb::LogicalType,_true>::get<true>(&by_types,(size_type)__n_00);
    uVar5 = duckdb::CastFunctionSet::ImplicitCastCost(pLVar4,&by_type);
    pLVar4 = __n;
    if (uVar5 < 0x7fffffffffffffff) {
      pLVar4 = __n_00;
    }
    if (-1 < (long)uVar5) {
      __n = pLVar4;
    }
  }
  if (__n != (LogicalType *)0xffffffffffffffff) {
    pvVar3 = vector<duckdb::LogicalType,_true>::get<true>(&by_types,(size_type)__n);
    LogicalType::operator=(&by_type,pvVar3);
  }
LAB_00520bb2:
  std::__cxx11::string::string((string *)&name,(string *)&function->field_0x8);
  if (local_1b7 == '\t') {
    GetArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>,long>
              (&local_160,(duckdb *)&by_type,&decimal_type,pLVar4);
  }
  else if (local_1b7 == '\a') {
    GetArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>,int>
              (&local_160,(duckdb *)&by_type,&decimal_type,pLVar4);
  }
  else if (local_1b7 == '\x05') {
    GetArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>,short>
              (&local_160,(duckdb *)&by_type,&decimal_type,pLVar4);
  }
  else {
    GetArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>,duckdb::hugeint_t>
              (&local_160,(duckdb *)&by_type,&decimal_type,pLVar4);
  }
  AggregateFunction::operator=(function,&local_160);
  AggregateFunction::~AggregateFunction(&local_160);
  std::__cxx11::string::operator=((string *)&function->field_0x8,(string *)&name);
  LogicalType::operator=((LogicalType *)&function->field_0x90,&decimal_type);
  *(undefined8 *)this = 0;
  std::__cxx11::string::~string((string *)&name);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            (&by_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  duckdb::LogicalType::~LogicalType(&by_type);
  duckdb::LogicalType::~LogicalType(&decimal_type);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

static unique_ptr<FunctionData> BindDecimalArgMinMax(ClientContext &context, AggregateFunction &function,
                                                     vector<unique_ptr<Expression>> &arguments) {
	auto decimal_type = arguments[0]->return_type;
	auto by_type = arguments[1]->return_type;

	// To avoid a combinatorial explosion, cast the ordering argument to one from the list
	auto by_types = ArgMaxByTypes();
	idx_t best_target = DConstants::INVALID_INDEX;
	int64_t lowest_cost = NumericLimits<int64_t>::Maximum();
	for (idx_t i = 0; i < by_types.size(); ++i) {
		// Before falling back to casting, check for a physical type match for the by_type
		if (by_types[i].InternalType() == by_type.InternalType()) {
			lowest_cost = 0;
			best_target = DConstants::INVALID_INDEX;
			break;
		}

		auto cast_cost = CastFunctionSet::Get(context).ImplicitCastCost(by_type, by_types[i]);
		if (cast_cost < 0) {
			continue;
		}
		if (cast_cost < lowest_cost) {
			best_target = i;
		}
	}

	if (best_target != DConstants::INVALID_INDEX) {
		by_type = by_types[best_target];
	}

	auto name = std::move(function.name);
	function = GetDecimalArgMinMaxFunction<OP>(by_type, decimal_type);
	function.name = std::move(name);
	function.return_type = decimal_type;
	return nullptr;
}